

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O1

void runOnce<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  int iVar4;
  Sequence *pSVar5;
  ulong uVar6;
  atomic<long> *paVar7;
  ostream *poVar8;
  ulong uVar9;
  Sequence *pSVar10;
  long lVar11;
  long *plVar12;
  undefined4 uVar13;
  undefined4 uVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> s;
  string local_380;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_360;
  reference_wrapper<disruptor::Sequence> local_340;
  undefined1 local_338 [32];
  long *local_318;
  undefined8 local_310;
  long *local_308;
  undefined1 local_300 [584];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_b8 [5];
  undefined1 auVar14 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Staring run ",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  LOCK();
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  UNLOCK();
  uVar9 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar9;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x78),8) == 0) {
    uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  }
  pSVar5 = (Sequence *)operator_new__(uVar6);
  auVar2 = _DAT_00129040;
  auVar1 = _DAT_00129030;
  if (uVar9 != 0) {
    uVar6 = uVar9 * 0x78 - 0x78;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar6;
    uVar13 = SUB164(auVar18 * ZEXT816(0x8888888888888889),8);
    uVar16 = (undefined4)(uVar6 / 0x1e0000000);
    auVar14._0_8_ = CONCAT44(uVar16,uVar13);
    auVar14._8_4_ = uVar13;
    auVar14._12_4_ = uVar16;
    auVar15._0_8_ = auVar14._0_8_ >> 6;
    auVar15._8_8_ = auVar14._8_8_ >> 6;
    paVar7 = &pSVar5[1].sequence_;
    uVar9 = 0;
    auVar15 = auVar15 ^ _DAT_00129040;
    do {
      auVar17._8_4_ = (int)uVar9;
      auVar17._0_8_ = uVar9;
      auVar17._12_4_ = (int)(uVar9 >> 0x20);
      auVar18 = (auVar17 | auVar1) ^ auVar2;
      if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                  auVar15._4_4_ < auVar18._4_4_) & 1)) {
        paVar7[-0xf] = (__atomic_base<long>)0xffffffffffffffff;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        (paVar7->super___atomic_base<long>)._M_i = -1;
      }
      uVar9 = uVar9 + 2;
      paVar7 = paVar7 + 0x1e;
    } while ((uVar6 / 0x78 + 2 & 0xfffffffffffffffe) != uVar9);
  }
  sVar3 = RING_BUFFER_SIZE;
  local_360.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_360.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Sequence **)0x0;
  disruptor::RingBuffer<long,_64>::RingBuffer((RingBuffer<long,_64> *)local_300,RING_BUFFER_SIZE);
  local_300._184_8_ = -1;
  local_300._248_8_ = sVar3;
  local_300._312_8_ = -1;
  local_300._432_8_ = -1;
  local_300._496_16_ = (undefined1  [16])0x0;
  local_300._512_16_ = (undefined1  [16])0x0;
  local_300._528_8_ = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(local_300 + 0x218));
  local_b8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < nc) {
    lVar11 = 0;
    pSVar10 = pSVar5;
    do {
      local_380._M_dataplus._M_p = (pointer)pSVar10;
      if (local_360.
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_360.
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>>::
        _M_realloc_insert<disruptor::Sequence*>
                  ((vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>> *)&local_360,
                   (iterator)
                   local_360.
                   super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Sequence **)&local_380);
      }
      else {
        *local_360.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
        local_360.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_360.
             super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar11 = lVar11 + 1;
      pSVar10 = pSVar10 + 1;
    } while (lVar11 < nc);
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::operator=
            (local_b8,&local_360);
  iVar4 = nc;
  lVar11 = (long)nc;
  uVar6 = lVar11 * 8;
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (lVar11 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_308 = (long *)operator_new__(uVar9);
  *local_308 = lVar11;
  plVar12 = local_308 + 1;
  if (iVar4 != 0) {
    memset(plVar12,0,uVar6);
  }
  if (0 < nc) {
    lVar11 = 0;
    pSVar10 = pSVar5;
    do {
      local_338._0_8_ = local_300;
      local_340._M_data = pSVar10;
      std::thread::
      thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>,std::reference_wrapper<disruptor::Sequence>,void>
                ((thread *)&local_380,
                 consume<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>,
                 (reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_>
                  *)local_338,&local_340);
      if (plVar12[lVar11] != 0) goto LAB_0011ce4a;
      plVar12[lVar11] = (long)local_380._M_dataplus._M_p;
      lVar11 = lVar11 + 1;
      pSVar10 = pSVar10 + 1;
    } while (lVar11 < nc);
  }
  iVar4 = np;
  lVar11 = (long)np;
  uVar6 = lVar11 * 8;
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (lVar11 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_318 = (long *)operator_new__(uVar9);
  *local_318 = lVar11;
  plVar12 = local_318 + 1;
  if (iVar4 != 0) {
    memset(plVar12,0,uVar6);
  }
  local_310 = std::chrono::_V2::system_clock::now();
  if (0 < np) {
    lVar11 = 0;
    do {
      local_338._0_8_ = local_300;
      std::thread::
      thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>,void>
                ((thread *)&local_380,
                 produce<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>,
                 (reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_>
                  *)local_338);
      if (plVar12[lVar11] != 0) goto LAB_0011ce4a;
      plVar12[lVar11] = (long)local_380._M_dataplus._M_p;
      lVar11 = lVar11 + 1;
    } while (lVar11 < np);
  }
  plVar12 = local_308;
  if (0 < np) {
    lVar11 = 0;
    do {
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < np);
  }
  if (0 < nc) {
    lVar11 = 0;
    do {
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < nc);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nBatch size: ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," Ring buffer size: ",0x13);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," Alignment: ",0xc);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x40);
  local_380._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_380,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cursor: ",8);
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  local_380._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_380,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum: ",5);
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," Expected sum: ",0xf);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  local_380._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_380,1);
  std::chrono::_V2::system_clock::now();
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,np);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"P-",2);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,nc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"C ",2);
  demangle_abi_cxx11_(&local_380,"N9disruptor21MultiThreadedStrategyE");
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  demangle_abi_cxx11_((string *)local_338,"N9disruptor16BlockingStrategyE");
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_338._0_8_,local_338._8_8_);
  local_340._M_data._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_340,1);
  if ((Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> *)
      local_338._0_8_ !=
      (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> *)
      (local_338 + 0x10)) {
    operator_delete((void *)local_338._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ops/secs",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Milliseconds: ",0xe);
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
  if (*plVar12 != 0) {
    lVar11 = *plVar12 << 3;
    do {
      if (*(long *)((long)plVar12 + lVar11) != 0) goto LAB_0011ce4a;
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  operator_delete__(plVar12);
  if (*local_318 != 0) {
    lVar11 = *local_318 << 3;
    do {
      if (*(long *)((long)local_318 + lVar11) != 0) {
LAB_0011ce4a:
        std::terminate();
      }
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  operator_delete__(local_318);
  operator_delete__(pSVar5);
  if (local_b8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8[0].
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::condition_variable::~condition_variable((condition_variable *)(local_300 + 0x218));
  if ((pointer)local_300._64_8_ != (pointer)0x0) {
    operator_delete((void *)local_300._64_8_);
  }
  if (local_360.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}